

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DOMRangeImpl::getCollapsed(DOMRangeImpl *this)

{
  DOMException *this_00;
  bool local_31;
  DOMRangeImpl *this_local;
  
  if ((this->fDetached & 1U) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0,this->fMemoryManager);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  local_31 = false;
  if (this->fStartContainer == this->fEndContainer) {
    local_31 = this->fStartOffset == this->fEndOffset;
  }
  return local_31;
}

Assistant:

bool DOMRangeImpl::getCollapsed() const
{
    if (fDetached)
    {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }

    return ((fStartContainer == fEndContainer)
             && (fStartOffset == fEndOffset));
}